

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O0

ZyanStatus
ZydisFormatterIntelFormatOperandMEM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  ZyanStatus status_047620348_16;
  ZyanStatus status_047620348_15;
  ZyanStatus status_047620348_14;
  ZyanStatus status_047620348_13;
  ZyanStatus status_047620348_12;
  ZyanStatus status_047620348_11;
  ZyanStatus status_047620348_10;
  ZyanStatus status_047620348_9;
  ZyanStatus status_047620348_8;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status_047620348_5;
  ZyanBool neither_reg_nor_idx;
  ZyanBool should_print_idx;
  ZyanBool should_print_reg;
  ZyanStatus status_047620348_4;
  ZyanBool absolute;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,199,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,200,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0xc9,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (((((context->operand->field_10).mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
       ((context->operand->field_10).mem.type == ZYDIS_MEMOP_TYPE_AGEN)) ||
      ((context->operand->field_10).mem.type == ZYDIS_MEMOP_TYPE_MAX_VALUE)) &&
     (ZVar1 = (*formatter->func_print_typecast)(formatter,buffer,context), (ZVar1 & 0x80000000) != 0
     )) {
    return ZVar1;
  }
  ZVar1 = (*formatter->func_print_segment)(formatter,buffer,context);
  if ((ZVar1 & 0x80000000) != 0) {
    return ZVar1;
  }
  if (buffer->is_token_list == '\0') {
    uVar2 = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_BEGIN_INTEL);
  }
  else {
    uVar2 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_BEGIN_INTEL);
  }
  if ((uVar2 & 0x80000000) != 0) {
    return uVar2;
  }
  bVar3 = false;
  if (formatter->force_relative_riprel == '\0') {
    bVar3 = context->runtime_address != 0xffffffffffffffff;
  }
  if ((((bVar3) && (*(char *)((long)&context->operand->field_10 + 0x21) != '\0')) &&
      ((context->operand->field_10).mem.index == ZYDIS_REGISTER_NONE)) &&
     ((((context->operand->field_10).mem.base == ZYDIS_REGISTER_NONE ||
       ((context->operand->field_10).mem.base == ZYDIS_REGISTER_EIP)) ||
      ((context->operand->field_10).mem.base == ZYDIS_REGISTER_RIP)))) {
    uVar2 = (*formatter->func_print_address_abs)(formatter,buffer,context);
  }
  else {
    bVar3 = (context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE;
    bVar4 = (context->operand->field_10).mem.index != ZYDIS_REGISTER_NONE;
    if ((bVar3) &&
       (ZVar1 = (*formatter->func_print_register)
                          (formatter,buffer,context,(context->operand->field_10).mem.base),
       (ZVar1 & 0x80000000) != 0)) {
      return ZVar1;
    }
    if (bVar4) {
      if ((context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE) {
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShort(&buffer->string,&STR_ADD);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_ADD)
          ;
        }
        if ((uVar2 & 0x80000000) != 0) {
          return uVar2;
        }
      }
      ZVar1 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->operand->field_10).mem.index);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
      if ((((context->operand->field_10).mem.scale != '\0') &&
          ((context->operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)) &&
         ((1 < (context->operand->field_10).mem.scale || (formatter->force_memory_scale != '\0'))))
      {
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShort(&buffer->string,&STR_MUL);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_MUL)
          ;
        }
        if ((uVar2 & 0x80000000) != 0) {
          return uVar2;
        }
        if ((buffer->is_token_list != '\0') &&
           (ZVar1 = ZydisFormatterBufferAppend(buffer,'\v'), (ZVar1 & 0x80000000) != 0)) {
          return ZVar1;
        }
        ZVar1 = ZydisStringAppendDecU
                          (&buffer->string,(ulong)(context->operand->field_10).mem.scale,'\0',
                           (ZyanStringView *)0x0,(ZyanStringView *)0x0);
        if ((ZVar1 & 0x80000000) != 0) {
          return ZVar1;
        }
      }
    }
    if (bVar3 || bVar4) {
      if ((*(char *)((long)&context->operand->field_10 + 0x21) == '\0') ||
         ((context->operand->field_10).mem.disp.value == 0)) goto LAB_0012d963;
      uVar2 = (*formatter->func_print_disp)(formatter,buffer,context);
    }
    else {
      uVar2 = (*formatter->func_print_address_abs)(formatter,buffer,context);
    }
  }
  if ((uVar2 & 0x80000000) != 0) {
    return uVar2;
  }
LAB_0012d963:
  if (buffer->is_token_list == '\0') {
    formatter_local._4_4_ = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_END_INTEL);
  }
  else {
    formatter_local._4_4_ =
         ZydisFormatterBufferAppendPredefined
                   (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_END_INTEL);
  }
  if ((formatter_local._4_4_ & 0x80000000) == 0) {
    formatter_local._4_4_ = 0x100000;
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    if ((context->operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
        (context->operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN) ||
        (context->operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB))
    {
        ZYAN_CHECK(formatter->func_print_typecast(formatter, buffer, context));
    }
    ZYAN_CHECK(formatter->func_print_segment(formatter, buffer, context));

    ZYDIS_BUFFER_APPEND(buffer, MEMORY_BEGIN_INTEL);

    const ZyanBool absolute = !formatter->force_relative_riprel &&
        (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
    if (absolute && context->operand->mem.disp.size &&
        (context->operand->mem.index == ZYDIS_REGISTER_NONE) &&
       ((context->operand->mem.base  == ZYDIS_REGISTER_NONE) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_EIP ) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_RIP )))
    {
        // EIP/RIP-relative or absolute-displacement address operand
        ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
    } else
    {
        const ZyanBool should_print_reg = context->operand->mem.base != ZYDIS_REGISTER_NONE;
        const ZyanBool should_print_idx = context->operand->mem.index != ZYDIS_REGISTER_NONE;
        const ZyanBool neither_reg_nor_idx = !should_print_reg && !should_print_idx;

        // Regular memory operand
        if (should_print_reg)
        {
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.base));
        }
        if (should_print_idx)
        {
            if (context->operand->mem.base != ZYDIS_REGISTER_NONE)
            {
                ZYDIS_BUFFER_APPEND(buffer, ADD);
            }
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.index));
            if (context->operand->mem.scale &&
                (context->operand->mem.type != ZYDIS_MEMOP_TYPE_MIB) &&
                ((context->operand->mem.scale > 1) || formatter->force_memory_scale))
            {
                ZYDIS_BUFFER_APPEND(buffer, MUL);
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
                ZYAN_CHECK(ZydisStringAppendDecU(&buffer->string, context->operand->mem.scale, 0,
                    ZYAN_NULL, ZYAN_NULL));
            }
        }
        if (neither_reg_nor_idx)
        {
            ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
        } else if (context->operand->mem.disp.size && context->operand->mem.disp.value)
        {
            ZYAN_CHECK(formatter->func_print_disp(formatter, buffer, context));
        }
    }

    ZYDIS_BUFFER_APPEND(buffer, MEMORY_END_INTEL);
    return ZYAN_STATUS_SUCCESS;
}